

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int ly_set_add(ly_set *set,void *node,int options)

{
  int iVar1;
  ulong uVar2;
  lys_node **__ptr;
  LY_ERR *pLVar3;
  ulong uVar4;
  
  if (set == (ly_set *)0x0 || node == (void *)0x0) {
    pLVar3 = ly_errno_location();
    *pLVar3 = LY_EINVAL;
LAB_0015cdfe:
    iVar1 = -1;
  }
  else {
    uVar2 = (ulong)set->number;
    if ((options & 1U) == 0) {
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        uVar4 = 0;
        do {
          if ((set->set).s[uVar4] == (lys_node *)node) {
            return (int)uVar4;
          }
          uVar4 = uVar4 + 1;
        } while (uVar2 != uVar4);
      }
    }
    __ptr = (set->set).s;
    if (set->size == (uint)uVar2) {
      __ptr = (lys_node **)realloc(__ptr,(ulong)((uint)uVar2 + 8) << 3);
      if (__ptr == (lys_node **)0x0) {
        pLVar3 = ly_errno_location();
        *pLVar3 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","ly_set_add");
        goto LAB_0015cdfe;
      }
      set->size = set->size + 8;
      (set->set).s = __ptr;
      uVar2 = (ulong)set->number;
    }
    iVar1 = (int)uVar2;
    set->number = iVar1 + 1;
    __ptr[uVar2] = (lys_node *)node;
  }
  return iVar1;
}

Assistant:

API int
ly_set_add(struct ly_set *set, void *node, int options)
{
    unsigned int i;
    void **new;

    if (!set || !node) {
        ly_errno = LY_EINVAL;
        return -1;
    }

    if (!(options & LY_SET_OPT_USEASLIST)) {
        /* search for duplication */
        for (i = 0; i < set->number; i++) {
            if (set->set.g[i] == node) {
                /* already in set */
                return i;
            }
        }
    }

    if (set->size == set->number) {
        new = realloc(set->set.g, (set->size + 8) * sizeof *(set->set.g));
        if (!new) {
            LOGMEM;
            return -1;
        }
        set->size += 8;
        set->set.g = new;
    }

    set->set.g[set->number++] = node;

    return set->number - 1;
}